

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O0

bool __thiscall ritobin::io::impl_text_read::TextReader::read_name(TextReader *this,string *value)

{
  bool bVar1;
  const_reference pvVar2;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char *local_50;
  value_type *c;
  const_iterator __end3;
  const_iterator __begin3;
  string_view *__range3;
  string_view word;
  string *value_local;
  TextReader *this_local;
  
  word._M_str = (char *)value;
  ___range3 = read_word(this);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&__range3);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,0);
    bVar1 = in_range<(char)97,(char)122>(*pvVar2);
    if (!bVar1) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,0);
      bVar1 = in_range<(char)65,(char)90>(*pvVar2);
      if (!bVar1) {
        return false;
      }
    }
    __begin3 = (const_iterator)&__range3;
    __end3 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                       ((basic_string_view<char,_std::char_traits<char>_> *)__begin3);
    c = std::basic_string_view<char,_std::char_traits<char>_>::end
                  ((basic_string_view<char,_std::char_traits<char>_> *)__begin3);
    for (; __end3 != c; __end3 = __end3 + 1) {
      local_50 = __end3;
      if ((((*__end3 != '_') && (bVar1 = in_range<(char)97,(char)122>(*__end3), !bVar1)) &&
          (bVar1 = in_range<(char)65,(char)90>(*local_50), !bVar1)) &&
         (bVar1 = in_range<(char)48,(char)57>(*local_50), !bVar1)) {
        return false;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_70,(basic_string_view<char,_std::char_traits<char>_> *)&__range3,
               &local_71);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)word._M_str,
               &local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool read_name(std::string& value) noexcept {
            auto const word = read_word();
            if (word.empty()) {
                return false;
            }
            if (!in_range<'a', 'z'>(word[0]) && !in_range<'A', 'Z'>(word[0])) {
                return false;
            }
            for (auto const& c : word) {
                if (c != '_'
                    && !in_range<'a', 'z'>(c)
                    && !in_range<'A', 'Z'>(c)
                    && !in_range<'0', '9'>(c)) {
                    return false;
                }
            }
            value = { std::string(word) };
            return true;
        }